

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void glad_gl_load_GL_ARB_texture_compression(GLADuserptrloadfunc load,void *userptr)

{
  void *userptr_local;
  GLADuserptrloadfunc load_local;
  
  if (GLAD_GL_ARB_texture_compression != 0) {
    glad_glGetCompressedTexImageARB =
         (PFNGLGETCOMPRESSEDTEXIMAGEARBPROC)(*load)("glGetCompressedTexImageARB",userptr);
    glad_glCompressedTexImage3DARB =
         (PFNGLCOMPRESSEDTEXIMAGE3DARBPROC)(*load)("glCompressedTexImage3DARB",userptr);
    glad_glCompressedTexImage2D =
         (PFNGLCOMPRESSEDTEXIMAGE2DPROC)(*load)("glCompressedTexImage2D",userptr);
    glad_glCompressedTexImage1DARB =
         (PFNGLCOMPRESSEDTEXIMAGE1DARBPROC)(*load)("glCompressedTexImage1DARB",userptr);
    glad_glCompressedTexSubImage1DARB =
         (PFNGLCOMPRESSEDTEXSUBIMAGE1DARBPROC)(*load)("glCompressedTexSubImage1DARB",userptr);
    glad_glCompressedTexImage3D =
         (PFNGLCOMPRESSEDTEXIMAGE3DPROC)(*load)("glCompressedTexImage3D",userptr);
    glad_glCompressedTexSubImage1D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE1DPROC)(*load)("glCompressedTexSubImage1D",userptr);
    glad_glCompressedTexSubImage2DARB =
         (PFNGLCOMPRESSEDTEXSUBIMAGE2DARBPROC)(*load)("glCompressedTexSubImage2DARB",userptr);
    glad_glCompressedTexSubImage3D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC)(*load)("glCompressedTexSubImage3D",userptr);
    glad_glCompressedTexSubImage3DARB =
         (PFNGLCOMPRESSEDTEXSUBIMAGE3DARBPROC)(*load)("glCompressedTexSubImage3DARB",userptr);
    glad_glGetCompressedTexImage =
         (PFNGLGETCOMPRESSEDTEXIMAGEPROC)(*load)("glGetCompressedTexImage",userptr);
    glad_glCompressedTexImage1D =
         (PFNGLCOMPRESSEDTEXIMAGE1DPROC)(*load)("glCompressedTexImage1D",userptr);
    glad_glCompressedTexSubImage2D =
         (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC)(*load)("glCompressedTexSubImage2D",userptr);
    glad_glCompressedTexImage2DARB =
         (PFNGLCOMPRESSEDTEXIMAGE2DARBPROC)(*load)("glCompressedTexImage2DARB",userptr);
  }
  return;
}

Assistant:

static void glad_gl_load_GL_ARB_texture_compression( GLADuserptrloadfunc load, void* userptr) {
    if(!GLAD_GL_ARB_texture_compression) return;
    glGetCompressedTexImageARB = (PFNGLGETCOMPRESSEDTEXIMAGEARBPROC) load("glGetCompressedTexImageARB", userptr);
    glCompressedTexImage3DARB = (PFNGLCOMPRESSEDTEXIMAGE3DARBPROC) load("glCompressedTexImage3DARB", userptr);
    glCompressedTexImage2D = (PFNGLCOMPRESSEDTEXIMAGE2DPROC) load("glCompressedTexImage2D", userptr);
    glCompressedTexImage1DARB = (PFNGLCOMPRESSEDTEXIMAGE1DARBPROC) load("glCompressedTexImage1DARB", userptr);
    glCompressedTexSubImage1DARB = (PFNGLCOMPRESSEDTEXSUBIMAGE1DARBPROC) load("glCompressedTexSubImage1DARB", userptr);
    glCompressedTexImage3D = (PFNGLCOMPRESSEDTEXIMAGE3DPROC) load("glCompressedTexImage3D", userptr);
    glCompressedTexSubImage1D = (PFNGLCOMPRESSEDTEXSUBIMAGE1DPROC) load("glCompressedTexSubImage1D", userptr);
    glCompressedTexSubImage2DARB = (PFNGLCOMPRESSEDTEXSUBIMAGE2DARBPROC) load("glCompressedTexSubImage2DARB", userptr);
    glCompressedTexSubImage3D = (PFNGLCOMPRESSEDTEXSUBIMAGE3DPROC) load("glCompressedTexSubImage3D", userptr);
    glCompressedTexSubImage3DARB = (PFNGLCOMPRESSEDTEXSUBIMAGE3DARBPROC) load("glCompressedTexSubImage3DARB", userptr);
    glGetCompressedTexImage = (PFNGLGETCOMPRESSEDTEXIMAGEPROC) load("glGetCompressedTexImage", userptr);
    glCompressedTexImage1D = (PFNGLCOMPRESSEDTEXIMAGE1DPROC) load("glCompressedTexImage1D", userptr);
    glCompressedTexSubImage2D = (PFNGLCOMPRESSEDTEXSUBIMAGE2DPROC) load("glCompressedTexSubImage2D", userptr);
    glCompressedTexImage2DARB = (PFNGLCOMPRESSEDTEXIMAGE2DARBPROC) load("glCompressedTexImage2DARB", userptr);
}